

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall
FfsParser::parseCommonSectionHeader
          (FfsParser *this,UByteArray *section,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index,bool insertIntoTree)

{
  char cVar1;
  byte type;
  TreeModel *this_00;
  bool bVar2;
  UINT32 UVar3;
  uint uVar4;
  ulong uVar5;
  UINT8 *ffsSize;
  CBString info;
  UByteArray local_f0;
  UModelIndex parentVolumeIndex;
  CBString name;
  UByteArray body;
  UByteArray header;
  CBString local_60;
  UModelIndex local_48;
  
  if (((section->d)._M_string_length & 0xfffffffc) != 0) {
    TreeModel::findParentOfType(&parentVolumeIndex,this->model,parent,'A');
    if ((((parentVolumeIndex.r < 0) || (parentVolumeIndex.c < 0)) ||
        (parentVolumeIndex.m == (TreeModel *)0x0)) ||
       (bVar2 = TreeModel::hasEmptyParsingData(this->model,&parentVolumeIndex), bVar2)) {
      ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
      uVar5 = 4;
    }
    else {
      TreeModel::parsingData(&header,this->model,&parentVolumeIndex);
      cVar1 = header.d._M_dataplus._M_p[0x19];
      std::__cxx11::string::~string((string *)&header);
      ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
      if (cVar1 == '\x03') {
        UVar3 = uint24ToUint32(ffsSize);
        uVar5 = (ulong)((uint)(UVar3 == 0xffffff) * 4 + 4);
      }
      else {
        uVar5 = 4;
      }
    }
    uVar4 = (uint)uVar5;
    if (uVar4 <= (uint)(section->d)._M_string_length) {
      type = ffsSize[3];
      UByteArray::left(&header,section,uVar4);
      UByteArray::mid(&body,section,uVar4,-1);
      sectionTypeToUString((CBString *)&local_f0,type);
      Bstrlib::CBString::CBString(&info," section");
      Bstrlib::CBString::operator+(&name,(CBString *)&local_f0,&info);
      Bstrlib::CBString::~CBString(&info);
      Bstrlib::CBString::~CBString((CBString *)&local_f0);
      uVar4 = (uint)(section->d)._M_string_length;
      usprintf(&info,"Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)",
               (ulong)type,(ulong)uVar4,(ulong)uVar4,uVar5,uVar5,
               (ulong)(uint)body.d._M_string_length,(ulong)(uint)body.d._M_string_length);
      if (insertIntoTree) {
        this_00 = this->model;
        Bstrlib::CBString::CBString(&local_60);
        local_f0.d._M_dataplus._M_p = (pointer)&local_f0.d.field_2;
        local_f0.d._M_string_length = 0;
        local_f0.d.field_2._M_local_buf[0] = '\0';
        TreeModel::addItem(&local_48,this_00,localOffset,'C',type,&name,&local_60,&info,&header,
                           &body,&local_f0,Movable,parent,'\0');
        index->m = local_48.m;
        index->r = local_48.r;
        index->c = local_48.c;
        index->i = local_48.i;
        std::__cxx11::string::~string((string *)&local_f0);
        Bstrlib::CBString::~CBString(&local_60);
      }
      Bstrlib::CBString::~CBString(&info);
      Bstrlib::CBString::~CBString(&name);
      std::__cxx11::string::~string((string *)&body);
      std::__cxx11::string::~string((string *)&header);
      return 0;
    }
  }
  return 0x14;
}

Assistant:

USTATUS FfsParser::parseCommonSectionHeader(const UByteArray & section, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index, const bool insertIntoTree)
{
    // Check sanity
    if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER)) {
        return U_INVALID_SECTION;
    }
    
    // Obtain required information from parent volume
    UINT8 ffsVersion = 2;
    UModelIndex parentVolumeIndex = model->findParentOfType(parent, Types::Volume);
    if (parentVolumeIndex.isValid() && model->hasEmptyParsingData(parentVolumeIndex) == false) {
        UByteArray data = model->parsingData(parentVolumeIndex);
        const VOLUME_PARSING_DATA* pdata = (const VOLUME_PARSING_DATA*)data.constData();
        ffsVersion = pdata->ffsVersion;
    }
    
    // Obtain header fields
    const EFI_COMMON_SECTION_HEADER* sectionHeader = (const EFI_COMMON_SECTION_HEADER*)(section.constData());
    UINT32 headerSize = sizeof(EFI_COMMON_SECTION_HEADER);
    if (ffsVersion == 3 && uint24ToUint32(sectionHeader->Size) == EFI_SECTION2_IS_USED)
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER2);
    UINT8 type = sectionHeader->Type;
    
    // Check sanity again
    if ((UINT32)section.size() < headerSize) {
        return U_INVALID_SECTION;
    }
    
    UByteArray header = section.left(headerSize);
    UByteArray body = section.mid(headerSize);
    
    // Get info
    UString name = sectionTypeToUString(type) + UString(" section");
    UString info = usprintf("Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)",
                            type,
                            (UINT32)section.size(), (UINT32)section.size(),
                            headerSize, headerSize,
                            (UINT32)body.size(), (UINT32)body.size());
    
    // Add tree item
    if (insertIntoTree) {
        index = model->addItem(localOffset, Types::Section, type, name, UString(), info, header, body, UByteArray(), Movable, parent);
    }
    
    return U_SUCCESS;
}